

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O2

_inlet * canvas_addinlet(_glist *x,t_pd *who,t_symbol *s)

{
  int iVar1;
  _inlet *p_Var2;
  
  p_Var2 = inlet_new(&x->gl_obj,who,s,(t_symbol *)0x0);
  if (((*(ushort *)&x->field_0xe8 & 8) == 0) &&
     (((byte)(*(ushort *)&x->field_0xe8 >> 0xb) & 1) == 0 && x->gl_owner != (_glist *)0x0)) {
    iVar1 = glist_isvisible(x->gl_owner);
    if (iVar1 != 0) {
      gobj_vis((t_gobj *)x,x->gl_owner,0);
      gobj_vis((t_gobj *)x,x->gl_owner,1);
      canvas_fixlinesfor(x->gl_owner,&x->gl_obj);
    }
  }
  if ((x->field_0xe8 & 8) == 0) {
    canvas_resortinlets(x);
  }
  return p_Var2;
}

Assistant:

t_inlet *canvas_addinlet(t_canvas *x, t_pd *who, t_symbol *s)
{
    t_inlet *ip = inlet_new(&x->gl_obj, who, s, 0);
    if (!x->gl_loading && x->gl_owner && !x->gl_isclone && glist_isvisible(x->gl_owner))
    {
        gobj_vis(&x->gl_gobj, x->gl_owner, 0);
        gobj_vis(&x->gl_gobj, x->gl_owner, 1);
        canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
    }
    if (!x->gl_loading) canvas_resortinlets(x);
    return (ip);
}